

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::AdvancedManyDrawCalls2::Run(AdvancedManyDrawCalls2 *this)

{
  bool bVar1;
  GLuint GVar2;
  int width;
  int height;
  size_type sVar3;
  reference data_00;
  uint *puVar4;
  CallLogWrapper *this_00;
  uint local_ac;
  GLuint i_1;
  GLuint *data_2;
  long status;
  allocator<unsigned_int> local_8d;
  int i;
  undefined1 local_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> data_1;
  char *pcStack_68;
  GLuint data;
  char *glsl_fs;
  char *glsl_vs;
  allocator<char> local_41;
  string local_40;
  int local_20;
  int local_1c;
  GLint p2;
  GLint p1;
  AdvancedManyDrawCalls2 *this_local;
  
  _p2 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92d0,&local_1c);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92d6,&local_20);
  if ((local_1c < 1) || (local_20 < 1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS or GL_MAX_FRAGMENT_ATOMIC_COUNTERS are less than required"
               ,&local_41);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local = (AdvancedManyDrawCalls2 *)0x10;
  }
  else {
    glsl_fs = 
    "#version 310 es\nvoid main() {\n#ifdef GL_ES\n  gl_PointSize = 1.0f;\n#endif\n  gl_Position = vec4(0, 0, 0, 1);\n}"
    ;
    pcStack_68 = 
    "#version 310 es\nlayout(binding = 0) uniform atomic_uint g_counter;\nlayout(std430, binding = 0) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  uint c = atomicCounterIncrement(g_counter);\n  g_output[c] = c;\n}"
    ;
    GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                      (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8b31,1,&glsl_fs);
    this->m_vsp = GVar2;
    GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                      (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8b30,1,&stack0xffffffffffffff98);
    this->m_fsp = GVar2;
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckProgram
                      (&this->super_SACSubcaseBase,this->m_vsp);
    if ((bVar1) &&
       (bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckProgram
                          (&this->super_SACSubcaseBase,this->m_fsp), bVar1)) {
      this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
      ;
      glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,1,this->m_vsp);
      glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,2,this->m_fsp);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->m_acbo);
      data_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      glu::CallLogWrapper::glBufferData
                (this_00,0x92c0,4,
                 (void *)((long)&data_1.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4),0x88ea);
      i = 0xffff;
      std::allocator<unsigned_int>::allocator(&local_8d);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,1000,
                 (value_type_conflict4 *)&i,&local_8d);
      std::allocator<unsigned_int>::~allocator(&local_8d);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_ssbo);
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      data_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,sVar3 << 2,data_00,0x88e9);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      glu::CallLogWrapper::glViewport
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,1,1);
      glu::CallLogWrapper::glBindProgramPipeline
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_ppo);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vao);
      for (status._4_4_ = 0; status._4_4_ < 100; status._4_4_ = status._4_4_ + 1) {
        glu::CallLogWrapper::glDrawArrays
                  (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,0,1);
      }
      width = glcts::anon_unknown_0::SACSubcaseBase::getWindowWidth(&this->super_SACSubcaseBase);
      height = glcts::anon_unknown_0::SACSubcaseBase::getWindowHeight(&this->super_SACSubcaseBase);
      glu::CallLogWrapper::glViewport
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,width,height);
      data_2 = (GLuint *)0x0;
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,this->m_acbo);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      puVar4 = (uint *)glu::CallLogWrapper::glMapBufferRange
                                 (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                                   super_CallLogWrapper,0x92c0,0,4,1);
      if (*puVar4 != 100) {
        data_2 = (GLuint *)&DAT_ffffffffffffffff;
        glcts::anon_unknown_0::Output("AC buffer content is %u, sholud be 100.\n",(ulong)*puVar4);
      }
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,0);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_ssbo);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      puVar4 = (uint *)glu::CallLogWrapper::glMapBufferRange
                                 (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                                   super_CallLogWrapper,0x90d2,0,400,3);
      std::sort<unsigned_int*>(puVar4,puVar4 + 100);
      for (local_ac = 0; local_ac < 100; local_ac = local_ac + 1) {
        if (puVar4[local_ac] != local_ac) {
          data_2 = (GLuint *)&DAT_ffffffffffffffff;
          glcts::anon_unknown_0::Output
                    ("data[%u] is %u, should be %u.\n",(ulong)local_ac,(ulong)puVar4[local_ac],
                     (ulong)local_ac);
        }
      }
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0);
      this_local = (AdvancedManyDrawCalls2 *)data_2;
    }
    else {
      this_local = (AdvancedManyDrawCalls2 *)&DAT_ffffffffffffffff;
    }
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2;
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, &p2);
		if (p1 < 1 || p2 < 1)
		{
			OutputNotSupported(
				"GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS or GL_MAX_FRAGMENT_ATOMIC_COUNTERS are less than required");
			return NOT_SUPPORTED;
		}

		const char* const glsl_vs = "#version 310 es" NL "void main() {" NL "#ifdef GL_ES" NL
									"  gl_PointSize = 1.0f;" NL "#endif" NL "  gl_Position = vec4(0, 0, 0, 1);" NL "}";
		const char* const glsl_fs =
			"#version 310 es" NL "layout(binding = 0) uniform atomic_uint g_counter;" NL
			"layout(std430, binding = 0) buffer Output {" NL "  uint g_output[];" NL "};" NL "void main() {" NL
			"  uint c = atomicCounterIncrement(g_counter);" NL "  g_output[c] = c;" NL "}";

		m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		m_fsp = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
		if (!CheckProgram(m_vsp) || !CheckProgram(m_fsp))
			return ERROR;

		glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_ppo, GL_FRAGMENT_SHADER_BIT, m_fsp);

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_acbo);
		{
			GLuint data = 0;
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, &data, GL_DYNAMIC_COPY);
		}

		{
			std::vector<GLuint> data(1000, 0xffff);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_ssbo);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * 4), &data[0], GL_DYNAMIC_READ);
		}

		// draw
		glViewport(0, 0, 1, 1);
		glBindProgramPipeline(m_ppo);
		glBindVertexArray(m_vao);
		for (int i = 0; i < 100; ++i)
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}

		glViewport(0, 0, getWindowWidth(), getWindowHeight());

		long status = NO_ERROR;

		{
			GLuint* data;

			glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_acbo);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			data = static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 4, GL_MAP_READ_BIT));
			if (data[0] != 100)
			{
				status = ERROR;
				Output("AC buffer content is %u, sholud be 100.\n", data[0]);
			}
			glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
			glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			data = static_cast<GLuint*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 100 * 4, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));
			std::sort(data, data + 100);
			for (GLuint i = 0; i < 100; ++i)
			{
				if (data[i] != i)
				{
					status = ERROR;
					Output("data[%u] is %u, should be %u.\n", i, data[i], i);
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}

		return status;
	}